

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3AddNotNull(Parse *pParse,int onError)

{
  byte *pbVar1;
  short sVar2;
  char *pcVar3;
  long lVar4;
  Vdbe *pVVar5;
  
  if ((pParse != (Parse *)0x0) && (sVar2 = *(short *)((long)&pParse->nLabel + 2), 0 < sVar2)) {
    pcVar3 = pParse->zErrMsg;
    lVar4 = (ulong)((int)sVar2 - 1) * 0x20;
    pcVar3[lVar4 + 0x18] = (char)onError;
    pbVar1 = (byte *)((long)&pParse->iSelfTab + 1);
    *pbVar1 = *pbVar1 | 2;
    if ((pcVar3[lVar4 + 0x1b] & 8U) != 0) {
      for (pVVar5 = pParse->pVdbe; pVVar5 != (Vdbe *)0x0; pVVar5 = *(Vdbe **)&pVVar5->nMem) {
        if (*(short *)((long)&pParse->nLabel + 2) + -1 == (int)*(short *)&pVVar5->pPrev->db) {
          pbVar1 = (byte *)((long)&pVVar5->nStmtDefImmCons + 3);
          *pbVar1 = *pbVar1 | 8;
        }
      }
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3AddNotNull(Parse *pParse, int onError){
  Table *p;
  Column *pCol;
  p = pParse->pNewTable;
  if( p==0 || NEVER(p->nCol<1) ) return;
  pCol = &p->aCol[p->nCol-1];
  pCol->notNull = (u8)onError;
  p->tabFlags |= TF_HasNotNull;

  /* Set the uniqNotNull flag on any UNIQUE or PK indexes already created
  ** on this column.  */
  if( pCol->colFlags & COLFLAG_UNIQUE ){
    Index *pIdx;
    for(pIdx=p->pIndex; pIdx; pIdx=pIdx->pNext){
      assert( pIdx->nKeyCol==1 && pIdx->onError!=OE_None );
      if( pIdx->aiColumn[0]==p->nCol-1 ){
        pIdx->uniqNotNull = 1;
      }
    }
  }
}